

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

RTPTime __thiscall
jrtplib::RTCPScheduler::CalculateDeterministicInterval(RTCPScheduler *this,bool sender)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_a0;
  double Td;
  double ntimesC;
  double tmin;
  RTPTime Tmin;
  double n;
  double C;
  double sfraction;
  int numtotal;
  int numsenders;
  bool sender_local;
  RTCPScheduler *this_local;
  
  iVar3 = RTPSources::GetSenderCount(this->sources);
  sfraction._4_4_ = RTPSources::GetActiveMemberCount(this->sources);
  if (sfraction._4_4_ == 0) {
    sfraction._4_4_ = 1;
  }
  dVar4 = RTCPSchedulerParams::GetSenderBandwidthFraction(&this->schedparams);
  if (dVar4 < (double)iVar3 / (double)sfraction._4_4_) {
    sVar1 = this->avgrtcppacksize;
    auVar8._8_4_ = (int)(sVar1 >> 0x20);
    auVar8._0_8_ = sVar1;
    auVar8._12_4_ = 0x45300000;
    dVar4 = RTCPSchedulerParams::GetRTCPBandwidth(&this->schedparams);
    n = ((auVar8._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / dVar4;
    iVar3 = sfraction._4_4_;
  }
  else if (sender) {
    sVar1 = this->avgrtcppacksize;
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    dVar4 = RTCPSchedulerParams::GetSenderBandwidthFraction(&this->schedparams);
    dVar5 = RTCPSchedulerParams::GetRTCPBandwidth(&this->schedparams);
    n = ((auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / (dVar4 * dVar5);
  }
  else {
    sVar1 = this->avgrtcppacksize;
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._0_8_ = sVar1;
    auVar7._12_4_ = 0x45300000;
    dVar4 = RTCPSchedulerParams::GetSenderBandwidthFraction(&this->schedparams);
    dVar5 = RTCPSchedulerParams::GetRTCPBandwidth(&this->schedparams);
    n = ((auVar7._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / ((1.0 - dVar4) * dVar5);
    iVar3 = sfraction._4_4_ - iVar3;
  }
  Tmin.m_t = (double)iVar3;
  tmin = (double)RTCPSchedulerParams::GetMinimumTransmissionInterval(&this->schedparams);
  ntimesC = RTPTime::GetDouble((RTPTime *)&tmin);
  if (((this->hassentrtcp & 1U) == 0) &&
     (bVar2 = RTCPSchedulerParams::GetUseHalfAtStartup(&this->schedparams), bVar2)) {
    ntimesC = ntimesC / 2.0;
  }
  local_a0 = Tmin.m_t * n;
  if (local_a0 < ntimesC) {
    local_a0 = ntimesC;
  }
  RTPTime::RTPTime((RTPTime *)&this_local,local_a0);
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTCPScheduler::CalculateDeterministicInterval(bool sender /* = false */)
{
	int numsenders = sources.GetSenderCount();
	int numtotal = sources.GetActiveMemberCount();

//	std::cout << "CalculateDeterministicInterval" << std::endl;
//	std::cout << "  numsenders: " << numsenders << std::endl;
//	std::cout << "  numtotal: " << numtotal << std::endl;

	// Try to avoid division by zero:
	if (numtotal == 0)
		numtotal++;

	double sfraction = ((double)numsenders)/((double)numtotal);
	double C,n;

	if (sfraction <= schedparams.GetSenderBandwidthFraction())
	{
		if (sender)
		{
			C = ((double)avgrtcppacksize)/(schedparams.GetSenderBandwidthFraction()*schedparams.GetRTCPBandwidth());
			n = (double)numsenders;
		}
		else
		{
			C = ((double)avgrtcppacksize)/((1.0-schedparams.GetSenderBandwidthFraction())*schedparams.GetRTCPBandwidth());
			n = (double)(numtotal-numsenders);
		}
	}
	else
	{
		C = ((double)avgrtcppacksize)/schedparams.GetRTCPBandwidth();
		n = (double)numtotal;
	}
	
	RTPTime Tmin = schedparams.GetMinimumTransmissionInterval();
	double tmin = Tmin.GetDouble();
	
	if (!hassentrtcp && schedparams.GetUseHalfAtStartup())
		tmin /= 2.0;

	double ntimesC = n*C;
	double Td = (tmin>ntimesC)?tmin:ntimesC;

	// TODO: for debugging
//	std::cout << "  Td: " << Td << std::endl;

	return RTPTime(Td);
}